

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPool.c
# Opt level: O1

void Acec_ManCountXorTreeInputs_rec
               (Gia_Man_t *p,int Node,Vec_Int_t *vXors,Vec_Int_t *vXorMap,Vec_Bit_t *vIsCarryRoot,
               Vec_Int_t *vCarryRootSet,Vec_Int_t *vXorSet)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  
  if (Node != 0) {
    if (p->nTravIdsAlloc <= Node) {
      __assert_fail("Id < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x267,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
    }
    if (p->pTravIds[Node] != p->nTravIds) {
      p->pTravIds[Node] = p->nTravIds;
      if ((-1 < Node) && (Node < vXorMap->nSize)) {
        iVar1 = vXorMap->pArray[(uint)Node];
        if (iVar1 == -1) {
          if (vIsCarryRoot->nSize <= Node) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                          ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
          }
          vXorSet = vCarryRootSet;
          if (((uint)vIsCarryRoot->pArray[(uint)Node >> 5] >> (Node & 0x1fU) & 1) == 0) {
            return;
          }
LAB_00666325:
          Vec_IntPush(vXorSet,Node);
          return;
        }
        if (-1 < iVar1) {
          uVar2 = iVar1 << 2;
          lVar4 = 3;
          uVar3 = (ulong)uVar2;
          do {
            uVar3 = uVar3 + 1;
            if (vXors->nSize <= (int)uVar3) goto LAB_00666338;
            Acec_ManCountXorTreeInputs_rec
                      (p,vXors->pArray[uVar3],vXors,vXorMap,vIsCarryRoot,vCarryRootSet,vXorSet);
            lVar4 = lVar4 + -1;
          } while (lVar4 != 0);
          if ((int)uVar2 < vXors->nSize) {
            Node = vXors->pArray[uVar2];
            goto LAB_00666325;
          }
        }
      }
LAB_00666338:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
  }
  return;
}

Assistant:

void Acec_ManCountXorTreeInputs_rec( Gia_Man_t * p, int Node, Vec_Int_t * vXors, Vec_Int_t * vXorMap, Vec_Bit_t * vIsCarryRoot, Vec_Int_t * vCarryRootSet, Vec_Int_t * vXorSet )
{
    int k, iXorBox;
    if ( Node == 0 || Gia_ObjIsTravIdCurrentId(p, Node) )
        return;
    Gia_ObjSetTravIdCurrentId(p, Node);
    iXorBox = Vec_IntEntry( vXorMap, Node );
    if ( iXorBox == -1 )
    {
        if ( Vec_BitEntry(vIsCarryRoot, Node) )
            Vec_IntPush( vCarryRootSet, Node );
        return;
    }
    for ( k = 1; k < 4; k++ )
        Acec_ManCountXorTreeInputs_rec( p, Vec_IntEntry(vXors, 4*iXorBox+k), vXors, vXorMap, vIsCarryRoot, vCarryRootSet, vXorSet );
    Vec_IntPush( vXorSet, Vec_IntEntry(vXors, 4*iXorBox) );
}